

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::RendererImpl<float>::doRenderAndConvertStreams<short>
          (RendererImpl<float> *this,DACOutputStreams<short> *streams,Bit32u len)

{
  Bit32u BStack_1809c;
  undefined1 auStack_18088 [4];
  Bit32u thisPassLen;
  DACOutputStreams<short> tmpStreams;
  DACOutputStreams<float> cnvStreams;
  float cnvReverbWetRight [4096];
  float cnvReverbWetLeft [4096];
  float cnvReverbDryRight [4096];
  float cnvReverbDryLeft [4096];
  float cnvNonReverbRight [4096];
  float cnvNonReverbLeft [4096];
  uint local_1c;
  Bit32u len_local;
  DACOutputStreams<short> *streams_local;
  RendererImpl<float> *this_local;
  
  tmpStreams.reverbWetRight = (short *)(cnvNonReverbRight + 0xffe);
  cnvStreams.nonReverbLeft = cnvReverbDryLeft + 0xffe;
  cnvStreams.nonReverbRight = cnvReverbDryRight + 0xffe;
  cnvStreams.reverbDryLeft = cnvReverbWetLeft + 0xffe;
  cnvStreams.reverbDryRight = cnvReverbWetRight + 0xffe;
  cnvStreams.reverbWetLeft = (float *)&cnvStreams.reverbWetRight;
  memcpy(auStack_18088,streams,0x30);
  for (local_1c = len; local_1c != 0; local_1c = local_1c - BStack_1809c) {
    if (local_1c < 0x1001) {
      BStack_1809c = local_1c;
    }
    else {
      BStack_1809c = 0x1000;
    }
    doRenderStreams(this,(DACOutputStreams<float> *)&tmpStreams.reverbWetRight,BStack_1809c);
    convertStreamsFormat<float,short>
              ((DACOutputStreams<float> *)&tmpStreams.reverbWetRight,
               (DACOutputStreams<short> *)auStack_18088,BStack_1809c);
    advanceStreams<short>((DACOutputStreams<short> *)auStack_18088,BStack_1809c);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvertStreams(const DACOutputStreams<O> &streams, Bit32u len) {
	Sample cnvNonReverbLeft[MAX_SAMPLES_PER_RUN], cnvNonReverbRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbDryLeft[MAX_SAMPLES_PER_RUN], cnvReverbDryRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbWetLeft[MAX_SAMPLES_PER_RUN], cnvReverbWetRight[MAX_SAMPLES_PER_RUN];

	const DACOutputStreams<Sample> cnvStreams = {
		cnvNonReverbLeft, cnvNonReverbRight,
		cnvReverbDryLeft, cnvReverbDryRight,
		cnvReverbWetLeft, cnvReverbWetRight
	};

	DACOutputStreams<O> tmpStreams = streams;

	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(cnvStreams, thisPassLen);
		convertStreamsFormat(cnvStreams, tmpStreams, thisPassLen);
		advanceStreams(tmpStreams, thisPassLen);
		len -= thisPassLen;
	}
}